

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_> *
mathiu::impl::coeffAndTerm
          (pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
           *__return_storage_ptr__,Expr *e)

{
  _Rb_tree_header *this;
  InternalPatternT<matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *this_00;
  element_type *peVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  IdProcess idProcess;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  __tmp;
  variant_alternative_t<1UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  _Var6;
  variant_alternative_t<3UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value_00;
  variant_alternative_t<4UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value_01;
  variant_alternative_t<5UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value_02;
  Product *pPVar7;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *__x;
  shared_ptr<const_mathiu::impl::Expr> *psVar8;
  long lVar9;
  undefined **ppuVar10;
  InternalPatternT<matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>
  *pIVar11;
  type __p;
  byte bVar12;
  Integer in_stack_fffffffffffff6dc;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> icoeff;
  ContextT context;
  App<matchit::impl::AsPointer<mathiu::impl::Product>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::__0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::_lambda(auto:1&&)_1_const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>>>
  local_7f8 [16];
  And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
  local_7e8;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_708;
  Id<mathiu::impl::Product> *local_6f8;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *local_6f0;
  App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_6e8;
  Product pCopy;
  Id<mathiu::impl::Product> ip;
  undefined1 local_518 [72];
  App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::__0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::_lambda(auto:1&&)_1_const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>
  local_4d0 [152];
  undefined1 local_438 [224];
  And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_358;
  App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_2c8;
  undefined1 local_230 [16];
  And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
  local_220;
  App<_f418f24_> local_130;
  
  bVar12 = 0;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id(&icoeff);
  matchit::impl::Id<mathiu::impl::Product>::Id(&ip);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_358,&icoeff);
  local_358.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Head_base<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_false>
  ._M_head_impl.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  ppuVar10 = &PTR_asPointer<mathiu::impl::Fraction>_00230d08;
  pIVar11 = (InternalPatternT<matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>
             *)((long)&local_358.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                       .
                       super__Head_base<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_false>
                       ._M_head_impl.mPatterns + 8);
  for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pIVar11->mPatterns).
    super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>
    .
    super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>
    .
    super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_false>
    ._M_head_impl.mUnary = (AsPointer<mathiu::impl::Fraction> *)*ppuVar10;
    ppuVar10 = ppuVar10 + (ulong)bVar12 * -2 + 1;
    pIVar11 = (InternalPatternT<matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>
               *)((long)pIVar11 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  local_358.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Head_base<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_false>
  ._M_head_impl.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_358.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .
  super__Head_base<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_false>
  ._M_head_impl.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_2c8.mUnary = (anon_class_1_0_00000001 *)&stack0xfffffffffffff6df;
  matchit::impl::
  And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::And(&local_2c8.mPattern,&local_358);
  matchit::impl::
  App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::{lambda(auto:1&&)#1}const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>
  ::operator()((App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::__0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::_lambda(auto:1&&)_1_const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>
                *)&local_6e8,&local_2c8);
  matchit::impl::Id<mathiu::impl::Product>::Id((Id<mathiu::impl::Product> *)local_518,&ip);
  matchit::impl::
  App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::{lambda(auto:1&&)#1}const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>
  ::operator()(local_4d0,&local_6e8);
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::{lambda(auto:1&&)#1}const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>
  ::operator()((And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::__0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::_lambda(auto:1&&)_1_const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>
                *)local_438,
               (And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
                *)local_518);
  this = &pCopy.super_ExprPtrMap._M_t._M_impl.super__Rb_tree_header;
  pCopy.super_ExprPtrMap._M_t._M_impl._0_8_ = &matchit::impl::deref;
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::{lambda(auto:1&&)#1}const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>
  ::operator()((And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::__0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::_lambda(auto:1&&)_1_const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>
                *)this,(And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
                        *)local_438);
  matchit::impl::
  App<matchit::impl::$_1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::{lambda(auto:1&&)#1}const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>
  ::operator()((App<matchit::impl::__1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::__0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::_lambda(auto:1&&)_1_const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>
                *)&context,
               (App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>_>
                *)&pCopy);
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
  ::~And((And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
          *)this);
  local_230._0_8_ = &matchit::impl::asPointer<mathiu::impl::Product>;
  matchit::impl::
  And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::{lambda(auto:1&&)#1}const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>>
  ::operator()((And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::__0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::_lambda(auto:1&&)_1_const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>>
                *)(local_230 + 8),(And<_5174cf6e_> *)&context);
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
  ::~And((And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
          *)((long)&context.mMemHolder._M_elems[0].
                    super__Variant_base<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                    .
                    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                    .
                    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                    .
                    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
            + 8));
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
  ::~And((And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
          *)local_438);
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
  ::~And((And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
          *)local_518);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_6e8.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_2c8.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_358);
  matchit::impl::
  App<matchit::impl::AsPointer<mathiu::impl::Product>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::{lambda(auto:1&&)#1}const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>>>
  ::operator()((App<matchit::impl::AsPointer<mathiu::impl::Product>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::__0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::_lambda(auto:1&&)_1_const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>>>
                *)&local_130,(App<_f418f24_> *)local_230);
  matchit::impl::
  App<matchit::impl::AsPointer<mathiu::impl::Product>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::{lambda(auto:1&&)#1}const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>>>
  ::operator()(local_7f8,&local_130);
  local_6f0 = &icoeff;
  local_6e8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._8_8_ = (element_type *)0x0;
  local_6e8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_6e8.mUnary = (anon_class_1_0_00000001 *)0x0;
  local_6e8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._M_rest =
       (_Variadic_union<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>)0x0;
  local_6f8 = &ip;
  memset(&context,0,0xe0);
  matchit::impl::
  Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
  ::Context(&context);
  pCopy.super_ExprPtrMap._M_t._M_impl._0_8_ = (Expr *)0x0;
  if (*(__index_type *)
       ((long)&(e->super_ExprVariant).
               super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Copy_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Variant_storage_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
       + 0x38) == '\b') {
    pCopy.super_ExprPtrMap._M_t._M_impl._0_8_ = e;
  }
  matchit::impl::
  Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>
  ::emplace_back<mathiu::impl::Product_const*>
            ((Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>
              *)&context,(Product **)&pCopy);
  value = std::
          get<1ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                    (context.mMemHolder._M_elems + (context.mSize - 1));
  bVar5 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Product_const*&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                    (value,&local_708,2,&context);
  if (!bVar5) {
    idProcess = kCANCEL;
    goto LAB_00164cf8;
  }
  pPVar7 = *value;
  this_00 = (InternalPatternT<matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
             *)((long)&local_7e8.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
                       .
                       super__Head_base<0UL,_matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_false>
                       ._M_head_impl.mPatterns + 8);
  if ((pPVar7->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00164cc1:
    matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::reset
              ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this_00,4);
LAB_00164ccc:
    idProcess = kCANCEL;
  }
  else {
    _Var6 = std::
            next<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                      ((pPVar7->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left,0);
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)&pCopy,
               (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)
               &_Var6._M_node[1]._M_left);
    matchit::impl::
    Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>
    ::emplace_back<std::shared_ptr<mathiu::impl::Expr_const>>
              ((Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>
                *)&context,(shared_ptr<const_mathiu::impl::Expr> *)&pCopy);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &pCopy.super_ExprPtrMap._M_t._M_impl.super__Rb_tree_header);
    value_00 = std::
               get<3ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                         (context.mMemHolder._M_elems + (context.mSize - 1));
    bVar5 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                      (value_00,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                                 *)((long)&local_7e8.mPatterns.
                                           super__Tuple_impl<0UL,_matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
                                           .
                                           super__Head_base<0UL,_matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_false>
                                           ._M_head_impl.mPatterns + 0x88),8,&context);
    if (!bVar5) {
LAB_00164c8d:
      matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::reset
                ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this_00,6);
      matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::reset
                ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this_00,5);
      sVar2 = (pPVar7->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      _Var6 = std::
              next<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                        ((pPVar7->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left,1);
      std::
      next<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                (_Var6,sVar2 - 1);
      goto LAB_00164cc1;
    }
    peVar1 = (value_00->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pCopy.super_ExprPtrMap._M_t._M_impl._0_8_ = (element_type *)0x0;
    if (*(__index_type *)
         ((long)&(peVar1->super_ExprVariant).
                 super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
         + 0x38) == '\0') {
      pCopy.super_ExprPtrMap._M_t._M_impl._0_8_ = peVar1;
    }
    matchit::impl::
    Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>
    ::emplace_back<int_const*>
              ((Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>
                *)&context,(int **)&pCopy);
    value_01 = std::
               get<4ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                         (context.mMemHolder._M_elems + (context.mSize - 1));
    bVar5 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<int_const*&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                      (value_01,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                                 *)((long)&local_7e8.mPatterns.
                                           super__Tuple_impl<0UL,_matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
                                           .
                                           super__Head_base<0UL,_matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_false>
                                           ._M_head_impl.mPatterns + 0x78),0xc,&context);
    if (!bVar5) {
      pCopy.super_ExprPtrMap._M_t._M_impl._0_8_ = (element_type *)0x0;
      if (*(__index_type *)
           ((long)&(peVar1->super_ExprVariant).
                   super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
           + 0x38) == '\x01') {
        pCopy.super_ExprPtrMap._M_t._M_impl._0_8_ = peVar1;
      }
      matchit::impl::
      Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>
      ::emplace_back<mathiu::impl::Fraction_const*>
                ((Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>
                  *)&context,(Fraction **)&pCopy);
      value_02 = std::
                 get<5ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                           (context.mMemHolder._M_elems + (context.mSize - 1));
      bVar5 = matchit::impl::
              PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
              ::
              matchPatternImpl<mathiu::impl::Fraction_const*&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                        (value_02,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                                   *)((long)&local_7e8.mPatterns.
                                             super__Tuple_impl<0UL,_matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
                                             .
                                             super__Head_base<0UL,_matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_false>
                                             ._M_head_impl.mPatterns + 0x50),0xc,&context);
      if (!bVar5) goto LAB_00164c8d;
    }
    bVar5 = matchit::impl::
            matchPattern<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                      (value_00,(Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this_00,7,&context
                      );
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this_00,6,(uint)bVar5);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this_00,5,(uint)bVar5);
    sVar2 = (pPVar7->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    _Var6 = std::
            next<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                      ((pPVar7->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left,1);
    std::
    next<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
              (_Var6,sVar2 - 1);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)this_00,4,(uint)bVar5);
    if (!bVar5) goto LAB_00164ccc;
    bVar5 = matchit::impl::
            matchPattern<mathiu::impl::Product_const&,matchit::impl::Id<mathiu::impl::Product>,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                      (pPVar7,(Id<mathiu::impl::Product> *)&local_7e8,4,&context);
    idProcess = (IdProcess)bVar5;
  }
  matchit::impl::operator()(&local_7e8,3,idProcess);
  matchit::impl::operator()(&local_7e8,2,idProcess);
LAB_00164cf8:
  matchit::impl::operator()(&local_7e8,1,idProcess);
  matchit::impl::operator()(&local_7e8,0,idProcess);
  if (idProcess == kCANCEL) {
    std::
    array<std::variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>,_9UL>
    ::~array(&context.mMemHolder);
    memset(&context,0,0xe0);
    matchit::impl::
    Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
    ::Context(&context);
    integer(in_stack_fffffffffffff6dc);
    std::make_shared<mathiu::impl::Expr_const,mathiu::impl::Expr_const&>((Expr *)local_518);
    __p = (type)&pCopy;
    pCopy.super_ExprPtrMap._M_t._M_impl._0_8_ = local_438._0_8_;
    pCopy.super_ExprPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_438._8_8_;
    local_438._0_8_ = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
    local_438._8_8_ = 0;
    pCopy.super_ExprPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_518._0_8_;
    pCopy.super_ExprPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_518._8_8_;
    local_518._0_8_ = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
    local_518._8_8_ = (_Base_ptr)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_518 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_438 + 8));
    std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::operator=((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                 *)&local_6e8,__p);
  }
  else {
    pPVar7 = matchit::impl::Id<mathiu::impl::Product>::get(local_6f8);
    if ((pPVar7->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count < 3) {
      psVar8 = matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::get(local_6f0);
      pPVar7 = matchit::impl::Id<mathiu::impl::Product>::get(local_6f8);
      lVar9 = std::_Rb_tree_decrement
                        (&(pPVar7->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header);
      std::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_true>
                ((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                  *)local_518,psVar8,(shared_ptr<const_mathiu::impl::Expr> *)(lVar9 + 0x30));
    }
    else {
      __x = (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
             *)matchit::impl::Id<mathiu::impl::Product>::get(local_6f8);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)&pCopy,__x);
      std::
      _Rb_tree<std::shared_ptr<mathiu::impl::Expr_const>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Select1st<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::shared_ptr<mathiu::impl::Expr_const>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Select1st<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                          *)&pCopy,
                         (iterator)
                         pCopy.super_ExprPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                        );
      psVar8 = matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::get(local_6f0);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)local_438,
                 (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)&pCopy);
      std::make_shared<mathiu::impl::Expr_const,mathiu::impl::Product>((Product *)&local_2c8);
      std::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_true>
                ((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                  *)local_518,psVar8,(shared_ptr<const_mathiu::impl::Expr> *)&local_2c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c8.mPattern);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                   *)local_438);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                   *)&pCopy);
    }
    __p = (type)local_518;
    std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::operator=((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                 *)&local_6e8,__p);
  }
  std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
  ~pair(__p);
  std::
  array<std::variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>,_9UL>
  ::~array(&context.mMemHolder);
  uVar4 = local_6e8.mPattern.mPatterns.
          super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
          .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
          ._M_head_impl.mBlock.
          super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          ._M_u._16_8_;
  uVar3 = local_6e8.mPattern.mPatterns.
          super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
          .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
          ._M_head_impl.mBlock.
          super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          .
          super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
          ._M_u._M_rest;
  local_6e8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._M_rest =
       (_Variadic_union<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>)0x0;
  (__return_storage_ptr__->first).
  super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6e8.mUnary;
  (__return_storage_ptr__->first).
  super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  local_6e8.mUnary = (anon_class_1_0_00000001 *)0x0;
  local_6e8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._16_8_ = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_6e8.mPattern.mPatterns.
       super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
       .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
       super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
       _M_head_impl.mBlock.
       super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       .
       super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       .
       super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       .
       super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       .
       super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       .
       super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       ._M_u._8_8_;
  (__return_storage_ptr__->second).
  super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  local_6e8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>.
  super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>.
  _M_head_impl.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._M_u._8_8_ = 0;
  std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
  ~pair((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
         *)&local_6e8);
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
  ::~And(&local_7e8);
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
  ::~And((InternalPatternT<matchit::impl::And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>_>
          *)((long)&local_130.mPattern.mPatterns.super__Tuple_impl<_ea061571_>.
                    super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>_>_>
                    .
                    super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>_>,_false>
            + 8));
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::App<const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:261:37)_&,_matchit::impl::And<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Or<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Wildcard>_>_>_>_>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::Ooo>,_matchit::impl::Id<mathiu::impl::Product>_>
  ::~And(&local_220);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&ip);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&icoeff);
  return __return_storage_ptr__;
}

Assistant:

std::pair<ExprPtr, ExprPtr> coeffAndTerm(Expr const &e)
    {
        constexpr auto firstIsCoeff = [](auto &&id, auto &&whole)
        {
            constexpr auto asCoeff = or_(as<Integer>(_), as<Fraction>(_));
            constexpr auto second = [](auto &&p)
            {
                return p.second;
            };
            // second part of the first pair
            return as<Product>(whole.at(ds(app(second, id.at(some(asCoeff))), ooo)));
        };

        Id<ExprPtr> icoeff;
        Id<Product> ip;
        return match(e)(
            pattern | firstIsCoeff(icoeff, ip) = [&]
            {
                if ((*ip).size() > 2)
                {
                    auto pCopy = *ip;
                    pCopy.erase(pCopy.begin());
                    return std::make_pair(*icoeff, makeSharedExprPtr(Product{pCopy}));
                }
                // single value left.
                // the basic unary transformation.
                return std::make_pair(*icoeff, (*(*ip).rbegin()).second);
            },
            pattern | _ = [&]
            { return std::make_pair(1_i, makeSharedExprPtr(e)); });
    }